

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayTests.cpp
# Opt level: O3

int __thiscall
glcts::TextureCubeMapArrayTests::init(TextureCubeMapArrayTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TextureCubeMapArraySamplingTest *this_00;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_01;
  TextureCubeMapArrayStencilAttachments *pTVar1;
  TextureCubeMapArrayTex3DValidation *this_02;
  TextureCubeMapArraySubImage3D *this_03;
  TextureCubeMapArrayGetterCalls *this_04;
  TextureCubeMapArrayGenerateMipMapFilterable *pTVar2;
  TextureCubeMapArrayGenerateMipMapNonFilterable *pTVar3;
  TextureCubeMapArrayImageOpCompute *pTVar4;
  TextureCubeMapArrayFBOIncompleteness *this_05;
  TextureCubeMapArrayTextureSizeTFVertexShader *this_06;
  TextureCubeMapArrayTextureSizeTFGeometryShader *this_07;
  TextureCubeMapArrayTextureSizeTFTessControlShader *this_08;
  TestNode *node;
  TextureCubeMapArrayTextureSizeRTFragmentShader *this_09;
  TextureCubeMapArrayTextureSizeRTComputeShader *this_10;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  this_00 = (TextureCubeMapArraySamplingTest *)operator_new(0x388);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  TextureCubeMapArraySamplingTest::TextureCubeMapArraySamplingTest
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams,"sampling","Test 1");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TextureCubeMapArrayColorDepthAttachmentsTest *)operator_new(0x308);
  TextureCubeMapArrayColorDepthAttachmentsTest::TextureCubeMapArrayColorDepthAttachmentsTest
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams,"color_depth_attachments",
             "Test 2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TextureCubeMapArrayStencilAttachments *)operator_new(0x2f0);
  TextureCubeMapArrayStencilAttachments::TextureCubeMapArrayStencilAttachments
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "stencil_attachments_mutable_nonlayered","Test 3",'\0','\0');
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureCubeMapArrayStencilAttachments *)operator_new(0x2f0);
  TextureCubeMapArrayStencilAttachments::TextureCubeMapArrayStencilAttachments
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "stencil_attachments_mutable_layered","Test 3",'\0','\x01');
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureCubeMapArrayStencilAttachments *)operator_new(0x2f0);
  TextureCubeMapArrayStencilAttachments::TextureCubeMapArrayStencilAttachments
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "stencil_attachments_immutable_nonlayered","Test 3",'\x01','\0');
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureCubeMapArrayStencilAttachments *)operator_new(0x2f0);
  TextureCubeMapArrayStencilAttachments::TextureCubeMapArrayStencilAttachments
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "stencil_attachments_immutable_layered","Test 3",'\x01','\x01');
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  this_02 = (TextureCubeMapArrayTex3DValidation *)operator_new(0x2b8);
  TextureCubeMapArrayTex3DValidation::TextureCubeMapArrayTex3DValidation
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams,"tex3D_validation","Test 4"
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TextureCubeMapArraySubImage3D *)operator_new(0x2f0);
  TextureCubeMapArraySubImage3D::TextureCubeMapArraySubImage3D
            (this_03,(this->super_TestCaseGroupBase).m_context,extParams,"subimage3D","Test 5");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (TextureCubeMapArrayGetterCalls *)operator_new(0x368);
  TextureCubeMapArrayGetterCalls::TextureCubeMapArrayGetterCalls
            (this_04,(this->super_TestCaseGroupBase).m_context,extParams,"getter_calls","Test 6");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar2 = (TextureCubeMapArrayGenerateMipMapFilterable *)operator_new(0x2e8);
  TextureCubeMapArrayGenerateMipMapFilterable::TextureCubeMapArrayGenerateMipMapFilterable
            (pTVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "generate_mip_map_filterable_internalformat_mutable",
             "Test 7.1 filterable internalformat - mutable storage",ST_MUTABLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TextureCubeMapArrayGenerateMipMapFilterable *)operator_new(0x2e8);
  TextureCubeMapArrayGenerateMipMapFilterable::TextureCubeMapArrayGenerateMipMapFilterable
            (pTVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "generate_mip_map_filterable_internalformat_immutable",
             "Test 7.1 filterable internalformat - immutable storage",ST_IMMUTABLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar3 = (TextureCubeMapArrayGenerateMipMapNonFilterable *)operator_new(0x2d0);
  TextureCubeMapArrayGenerateMipMapNonFilterable::TextureCubeMapArrayGenerateMipMapNonFilterable
            (pTVar3,(this->super_TestCaseGroupBase).m_context,extParams,
             "generate_mip_map_non_filterable_mutable_storage",
             "Test 7.2 non-filterable format - mutable storage",ST_MUTABLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pTVar3 = (TextureCubeMapArrayGenerateMipMapNonFilterable *)operator_new(0x2d0);
  TextureCubeMapArrayGenerateMipMapNonFilterable::TextureCubeMapArrayGenerateMipMapNonFilterable
            (pTVar3,(this->super_TestCaseGroupBase).m_context,extParams,
             "generate_mip_map_non_filterable_immutable_storage",
             "Test 7.2 non-filterable format - immutable storage",ST_IMMUTABLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pTVar4 = (TextureCubeMapArrayImageOpCompute *)operator_new(0x2f8);
  TextureCubeMapArrayImageOpCompute::TextureCubeMapArrayImageOpCompute
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"image_op_compute_sh",
             "Test 8 compute shader",STC_COMPUTE_SHADER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TextureCubeMapArrayImageOpCompute *)operator_new(0x2f8);
  TextureCubeMapArrayImageOpCompute::TextureCubeMapArrayImageOpCompute
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"image_op_vertex_sh",
             "Test 8 vertex shader",STC_VERTEX_SHADER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TextureCubeMapArrayImageOpCompute *)operator_new(0x2f8);
  TextureCubeMapArrayImageOpCompute::TextureCubeMapArrayImageOpCompute
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"image_op_fragment_sh",
             "Test 8 fragment shader",STC_FRAGMENT_SHADER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TextureCubeMapArrayImageOpCompute *)operator_new(0x2f8);
  TextureCubeMapArrayImageOpCompute::TextureCubeMapArrayImageOpCompute
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"image_op_geometry_sh",
             "Test 8 geometry shader",STC_GEOMETRY_SHADER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TextureCubeMapArrayImageOpCompute *)operator_new(0x2f8);
  TextureCubeMapArrayImageOpCompute::TextureCubeMapArrayImageOpCompute
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,
             "image_op_tessellation_control_sh","Test 8 tessellation control shader ",
             STC_TESSELLATION_CONTROL_SHADER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TextureCubeMapArrayImageOpCompute *)operator_new(0x2f8);
  TextureCubeMapArrayImageOpCompute::TextureCubeMapArrayImageOpCompute
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,
             "image_op_tessellation_evaluation_sh","Test 8 tessellation evaluation sahder",
             STC_TESSELLATION_EVALUATION_SHADER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  this_05 = (TextureCubeMapArrayFBOIncompleteness *)operator_new(0x2c0);
  TextureCubeMapArrayFBOIncompleteness::TextureCubeMapArrayFBOIncompleteness
            (this_05,(this->super_TestCaseGroupBase).m_context,extParams,"fbo_incompleteness",
             "Test 9");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (TextureCubeMapArrayTextureSizeTFVertexShader *)operator_new(0x2d0);
  TextureCubeMapArrayTextureSizeTFVertexShader::TextureCubeMapArrayTextureSizeTFVertexShader
            (this_06,(this->super_TestCaseGroupBase).m_context,extParams,"texture_size_vertex_sh",
             "test 10.1");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (TextureCubeMapArrayTextureSizeTFGeometryShader *)operator_new(0x2d0);
  TextureCubeMapArrayTextureSizeTFGeometryShader::TextureCubeMapArrayTextureSizeTFGeometryShader
            (this_07,(this->super_TestCaseGroupBase).m_context,extParams,"texture_size_geometry_sh",
             "test 10.2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  this_08 = (TextureCubeMapArrayTextureSizeTFTessControlShader *)operator_new(0x2d8);
  TextureCubeMapArrayTextureSizeTFTessControlShader::
  TextureCubeMapArrayTextureSizeTFTessControlShader
            (this_08,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_size_tesselation_con_sh","test 10.3");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  node = (TestNode *)operator_new(0x2d8);
  TextureCubeMapArrayTextureSizeTFTessEvaluationShader::
  TextureCubeMapArrayTextureSizeTFTessEvaluationShader
            ((TextureCubeMapArrayTextureSizeTFTessEvaluationShader *)node,
             (this->super_TestCaseGroupBase).m_context,extParams,"texture_size_tesselation_ev_sh",
             "test 10.4");
  tcu::TestNode::addChild((TestNode *)this,node);
  this_09 = (TextureCubeMapArrayTextureSizeRTFragmentShader *)operator_new(0x2d8);
  TextureCubeMapArrayTextureSizeRTFragmentShader::TextureCubeMapArrayTextureSizeRTFragmentShader
            (this_09,(this->super_TestCaseGroupBase).m_context,extParams,"texture_size_fragment_sh",
             "test 10.5");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  this_10 = (TextureCubeMapArrayTextureSizeRTComputeShader *)operator_new(0x2d8);
  TextureCubeMapArrayTextureSizeRTComputeShader::TextureCubeMapArrayTextureSizeRTComputeShader
            (this_10,(this->super_TestCaseGroupBase).m_context,extParams,"texture_size_compute_sh",
             "test 10.6");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  return extraout_EAX;
}

Assistant:

void TextureCubeMapArrayTests::init(void)
{
	/* Initialize base class */
	TestCaseGroupBase::init();

	/* Texture Cube Map Array Sampling (Test 1) */
	addChild(new TextureCubeMapArraySamplingTest(m_context, m_extParams, "sampling", "Test 1"));

	/* Texture Cube Map Array Attachment (Test 2) */
	addChild(
		new TextureCubeMapArrayColorDepthAttachmentsTest(m_context, m_extParams, "color_depth_attachments", "Test 2"));

	/* Texture Cube Map Array Stencil Attachments (Test 3) */
	addChild(new TextureCubeMapArrayStencilAttachments(m_context, m_extParams, "stencil_attachments_mutable_nonlayered",
													   "Test 3", false, false));
	addChild(new TextureCubeMapArrayStencilAttachments(m_context, m_extParams, "stencil_attachments_mutable_layered",
													   "Test 3", false, true));
	addChild(new TextureCubeMapArrayStencilAttachments(
		m_context, m_extParams, "stencil_attachments_immutable_nonlayered", "Test 3", true, false));
	addChild(new TextureCubeMapArrayStencilAttachments(m_context, m_extParams, "stencil_attachments_immutable_layered",
													   "Test 3", true, true));

	/* Texture Cube Map Array glTexImage3D() and glTexStorage3D() Validation (Test 4) */
	addChild(new TextureCubeMapArrayTex3DValidation(m_context, m_extParams, "tex3D_validation", "Test 4"));

	/* Texture Cube Map Array SubImage3D() (Test 5) */
	addChild(new TextureCubeMapArraySubImage3D(m_context, m_extParams, "subimage3D", "Test 5"));

	/* Texture Cube Map Array Getter Calls (Test 6) */
	addChild(new TextureCubeMapArrayGetterCalls(m_context, m_extParams, "getter_calls", "Test 6"));

	/* Texture Cube Map Array glGenerateMipmap() Validation (Test 7) */
	addChild(new TextureCubeMapArrayGenerateMipMapFilterable(
		m_context, m_extParams, "generate_mip_map_filterable_internalformat_mutable",
		"Test 7.1 filterable internalformat - mutable storage", ST_MUTABLE));

	addChild(new TextureCubeMapArrayGenerateMipMapFilterable(
		m_context, m_extParams, "generate_mip_map_filterable_internalformat_immutable",
		"Test 7.1 filterable internalformat - immutable storage", ST_IMMUTABLE));

	/* The following tests, as written, are only applicable to ES. */
	addChild(new TextureCubeMapArrayGenerateMipMapNonFilterable(
		m_context, m_extParams, "generate_mip_map_non_filterable_mutable_storage",
		"Test 7.2 non-filterable format - mutable storage", ST_MUTABLE));

	addChild(new TextureCubeMapArrayGenerateMipMapNonFilterable(
		m_context, m_extParams, "generate_mip_map_non_filterable_immutable_storage",
		"Test 7.2 non-filterable format - immutable storage", ST_IMMUTABLE));

	/* Texture Cube Map Array Image Operations (Test 8) */
	addChild(new TextureCubeMapArrayImageOpCompute(m_context, m_extParams, "image_op_compute_sh",
												   "Test 8 compute shader", STC_COMPUTE_SHADER));
	addChild(new TextureCubeMapArrayImageOpCompute(m_context, m_extParams, "image_op_vertex_sh", "Test 8 vertex shader",
												   STC_VERTEX_SHADER));
	addChild(new TextureCubeMapArrayImageOpCompute(m_context, m_extParams, "image_op_fragment_sh",
												   "Test 8 fragment shader", STC_FRAGMENT_SHADER));
	addChild(new TextureCubeMapArrayImageOpCompute(m_context, m_extParams, "image_op_geometry_sh",
												   "Test 8 geometry shader", STC_GEOMETRY_SHADER));

	addChild(new TextureCubeMapArrayImageOpCompute(m_context, m_extParams, "image_op_tessellation_control_sh",
												   "Test 8 tessellation control shader ",
												   STC_TESSELLATION_CONTROL_SHADER));

	addChild(new TextureCubeMapArrayImageOpCompute(m_context, m_extParams, "image_op_tessellation_evaluation_sh",
												   "Test 8 tessellation evaluation sahder",
												   STC_TESSELLATION_EVALUATION_SHADER));

	/* Texture Cube Map Array FBO incompleteness (Test 9) */
	addChild(new TextureCubeMapArrayFBOIncompleteness(m_context, m_extParams, "fbo_incompleteness", "Test 9"));

	/* textureSize and imageSize validation (Test 10) */
	addChild(new TextureCubeMapArrayTextureSizeTFVertexShader(m_context, m_extParams, "texture_size_vertex_sh",
															  "test 10.1"));
	addChild(new TextureCubeMapArrayTextureSizeTFGeometryShader(m_context, m_extParams, "texture_size_geometry_sh",
																"test 10.2"));
	addChild(new TextureCubeMapArrayTextureSizeTFTessControlShader(m_context, m_extParams,
																   "texture_size_tesselation_con_sh", "test 10.3"));
	addChild(new TextureCubeMapArrayTextureSizeTFTessEvaluationShader(m_context, m_extParams,
																	  "texture_size_tesselation_ev_sh", "test 10.4"));
	addChild(new TextureCubeMapArrayTextureSizeRTFragmentShader(m_context, m_extParams, "texture_size_fragment_sh",
																"test 10.5"));
	addChild(new TextureCubeMapArrayTextureSizeRTComputeShader(m_context, m_extParams, "texture_size_compute_sh",
															   "test 10.6"));
}